

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall Node::Output(Node *this,ostream *os)

{
  ostream *poVar1;
  string local_40;
  
  if (NeedIostreamH != 0) {
    poVar1 = std::operator<<(os,"#include <iostream>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(os,"#include <limits>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(os,"#include <array>");
    std::endl<char,std::char_traits<char>>(poVar1);
    NeedIostreamH = 0;
  }
  poVar1 = std::operator<<(os,"#include <cstdlib>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"#include <cstring>");
  std::endl<char,std::char_traits<char>>(poVar1);
  NeedStdlibH = 0;
  poVar1 = std::operator<<(os,"#include <unistd.h>");
  std::endl<char,std::char_traits<char>>(poVar1);
  NeedUnistd = 0;
  if (NeedMathH != 0) {
    poVar1 = std::operator<<(os,"#include <cmath>");
    std::endl<char,std::char_traits<char>>(poVar1);
    NeedMathH = 0;
  }
  if (NeedErrorH != 0) {
    poVar1 = std::operator<<(os,"#include <cerrno>");
    std::endl<char,std::char_traits<char>>(poVar1);
    NeedErrorH = 0;
  }
  if (NeedTimeH != 0) {
    poVar1 = std::operator<<(os,"#include <ctime>");
    std::endl<char,std::char_traits<char>>(poVar1);
    NeedTimeH = 0;
  }
  poVar1 = std::operator<<(os,"#include \"basicfun.h\"");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"#include \"basicchannel.h\"");
  std::endl<char,std::char_traits<char>>(poVar1);
  NeedChannel = 0;
  NeedBasicFun = 0;
  if (NeedDataList != 0) {
    poVar1 = std::operator<<(os,"#include \"datalist.h\"");
    std::endl<char,std::char_traits<char>>(poVar1);
    NeedDataList = 0;
  }
  if (NeedPuse != 0) {
    poVar1 = std::operator<<(os,"#include \"pusing.h\"");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (NeedVirtual != 0) {
    poVar1 = std::operator<<(os,"#include \"virtual.h\"");
    std::endl<char,std::char_traits<char>>(poVar1);
    NeedVirtual = 0;
  }
  std::endl<char,std::char_traits<char>>(os);
  if (NeedRFA != 0) {
    poVar1 = std::operator<<(os,"typedef char RmsRfa[6];");
    std::endl<char,std::char_traits<char>>(poVar1);
    NeedRFA = 0;
  }
  if (NeedPuse != 0) {
    poVar1 = std::operator<<(os,"static basic::PUsing PUse;\t// Needed for print using");
    std::endl<char,std::char_traits<char>>(poVar1);
    NeedPuse = 0;
  }
  Indent_abi_cxx11_(&local_40,this);
  poVar1 = std::operator<<(os,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,"extern basic::BasicError Be;");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::endl<char,std::char_traits<char>>(os);
  VariableList::OutputDef(Variables,os,Level);
  OutputPrototypes(this,os);
  Level = 0;
  OutputCode(this,os);
  return;
}

Assistant:

void Node::Output(
	std::ostream& os	/**< Stream to write C++ code to */
)
{
	//
	// Handle Include Files
	//
	if (NeedIostreamH != 0)
	{
		os << "#include <iostream>" << std::endl;
		os << "#include <limits>" << std::endl;
		os << "#include <array>" << std::endl;
		NeedIostreamH = 0;
	}

	os << "#include <cstdlib>" << std::endl;
	os << "#include <cstring>" << std::endl;
	NeedStdlibH = 0;

	os << "#include <unistd.h>" << std::endl;
	NeedUnistd = 0;

	if (NeedMathH != 0)
	{
		os << "#include <cmath>" << std::endl;
		NeedMathH = 0;
	}

	if (NeedErrorH != 0)
	{
		os << "#include <cerrno>" << std::endl;
		NeedErrorH = 0;
	}

	if (NeedTimeH != 0)
	{
		os << "#include <ctime>" << std::endl;
		NeedTimeH = 0;
	}

	os << "#include \"basicfun.h\"" << std::endl;
	os << "#include \"basicchannel.h\"" << std::endl;

	NeedChannel = 0;
	NeedBasicFun = 0;

	if (NeedDataList != 0)
	{
		os << "#include \"datalist.h\"" << std::endl;
		NeedDataList = 0;
	}

	if (NeedPuse != 0)
	{
		os << "#include \"pusing.h\"" << std::endl;
	}

	if (NeedVirtual != 0)
	{
		os << "#include \"virtual.h\"" << std::endl;
		NeedVirtual = 0;
	}

	os << std::endl;

	if (NeedRFA != 0)
	{
		os << "typedef char RmsRfa[6];" << std::endl;
		NeedRFA = 0;
	}

	if (NeedPuse != 0)
	{
		os << "static basic::PUsing PUse;\t// Needed for print using" << std::endl;
		NeedPuse = 0;
	}

	//
	// This code duplicates basicfun.h, but sometimes it is still needed
	// 
	os << Indent() << "extern basic::BasicError Be;" <<
		std::endl;

	os << std::endl;

	//
	// Output the variables
	//
	Variables->OutputDef(os, Level);

	//
	// Dump out prototypes
	//
	OutputPrototypes(os);

	//
	// Output code
	//
	Level = 0;
	OutputCode(os);
}